

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

RtAudioErrorType __thiscall
RtApi::openStream(RtApi *this,StreamParameters *oParams,StreamParameters *iParams,
                 RtAudioFormat format,uint sampleRate,uint *bufferFrames,RtAudioCallback callback,
                 void *userData,StreamOptions *options)

{
  pointer pDVar1;
  pointer pDVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  RtAudioErrorType RVar11;
  RtAudioErrorType type;
  ulong uVar12;
  bool bVar13;
  
  if ((this->stream_).state != STREAM_CLOSED) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->errorText_,0,(char *)(this->errorText_)._M_string_length,0x1f5692);
    RVar11 = RTAUDIO_INVALID_USE;
    type = RTAUDIO_INVALID_USE;
    goto LAB_0018aff1;
  }
  clearStreamInfo(this);
  if ((oParams == (StreamParameters *)0x0) || (oParams->nChannels != 0)) {
    if ((iParams != (StreamParameters *)0x0) && (iParams->nChannels == 0)) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar7 = 
      "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one."
      ;
      goto LAB_0018afdd;
    }
    if (oParams == (StreamParameters *)0x0 && iParams == (StreamParameters *)0x0) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar7 = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
      goto LAB_0018afdd;
    }
    uVar4 = formatBytes(this,format);
    if (uVar4 == 0) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar7 = "RtApi::openStream: \'format\' parameter value is undefined.";
      goto LAB_0018afdd;
    }
    if ((this->deviceList_).
        super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->deviceList_).
        super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*this->_vptr_RtApi[0xb])(this);
    }
    uVar4 = 0;
    uVar8 = 0;
    if (oParams != (StreamParameters *)0x0) {
      pDVar1 = (this->deviceList_).
               super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl
               .super__Vector_impl_data._M_start;
      pDVar2 = (this->deviceList_).
               super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl
               .super__Vector_impl_data._M_finish;
      uVar8 = ((long)pDVar2 - (long)pDVar1 >> 5) * -0x5555555555555555;
      if (pDVar2 == pDVar1) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        uVar6 = 1;
        do {
          if (pDVar1[uVar10].ID == oParams->deviceId) break;
          bVar13 = uVar6 <= uVar8;
          lVar3 = uVar8 - uVar6;
          uVar10 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar13 && lVar3 != 0);
      }
      if (uVar8 - uVar10 == 0) {
        pcVar9 = (char *)(this->errorText_)._M_string_length;
        pcVar7 = "RtApi::openStream: output device ID is invalid.";
        goto LAB_0018afdd;
      }
      uVar8 = (ulong)oParams->nChannels;
    }
    if (iParams == (StreamParameters *)0x0) {
LAB_0018b07c:
      if ((((int)uVar8 == 0) ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)oParams->deviceId,0,uVar8,(ulong)oParams->firstChannel,
                              sampleRate,format,bufferFrames,options), (char)iVar5 != '\0')) &&
         ((uVar4 == 0 ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)iParams->deviceId,1,(ulong)uVar4,
                              (ulong)iParams->firstChannel,sampleRate,format,bufferFrames,options),
          (char)iVar5 != '\0')))) {
        (this->stream_).callbackInfo.callback = callback;
        (this->stream_).callbackInfo.userData = userData;
        if (options != (StreamOptions *)0x0) {
          options->numberOfBuffers = (this->stream_).nBuffers;
        }
        (this->stream_).state = STREAM_STOPPED;
        return RTAUDIO_NO_ERROR;
      }
      RVar11 = RTAUDIO_SYSTEM_ERROR;
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0018aff1;
    }
    pDVar1 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar2 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar10 = ((long)pDVar2 - (long)pDVar1 >> 5) * -0x5555555555555555;
    if (pDVar2 == pDVar1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar12 = 1;
      do {
        if (pDVar1[uVar6].ID == iParams->deviceId) break;
        bVar13 = uVar12 <= uVar10;
        lVar3 = uVar10 - uVar12;
        uVar6 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar13 && lVar3 != 0);
    }
    if (uVar10 - uVar6 != 0) {
      uVar4 = iParams->nChannels;
      goto LAB_0018b07c;
    }
    std::__cxx11::string::operator=
              ((string *)&this->errorText_,"RtApi::openStream: input device ID is invalid.");
  }
  else {
    pcVar9 = (char *)(this->errorText_)._M_string_length;
    pcVar7 = 
    "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one."
    ;
LAB_0018afdd:
    std::__cxx11::string::_M_replace((ulong)&this->errorText_,0,pcVar9,(ulong)pcVar7);
  }
  RVar11 = RTAUDIO_INVALID_PARAMETER;
  type = RTAUDIO_INVALID_PARAMETER;
LAB_0018aff1:
  error(this,type);
  return RVar11;
}

Assistant:

RtAudioErrorType RtApi :: openStream( RtAudio::StreamParameters *oParams,
                                      RtAudio::StreamParameters *iParams,
                                      RtAudioFormat format, unsigned int sampleRate,
                                      unsigned int *bufferFrames,
                                      RtAudioCallback callback, void *userData,
                                      RtAudio::StreamOptions *options )
{
  if ( stream_.state != STREAM_CLOSED ) {
    errorText_ = "RtApi::openStream: a stream is already open!";
    return error( RTAUDIO_INVALID_USE );
  }

  // Clear stream information potentially left from a previously open stream.
  clearStreamInfo();

  if ( oParams && oParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( iParams && iParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( oParams == NULL && iParams == NULL ) {
    errorText_ = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( formatBytes(format) == 0 ) {
    errorText_ = "RtApi::openStream: 'format' parameter value is undefined.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  // Scan devices if none currently listed.
  if ( deviceList_.size() == 0 ) probeDevices();
  
  unsigned int m, oChannels = 0;
  if ( oParams ) {
    oChannels = oParams->nChannels;
    // Verify that the oParams->deviceId is found in our list
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == oParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: output device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  unsigned int iChannels = 0;
  if ( iParams ) {
    iChannels = iParams->nChannels;
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == iParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: input device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  bool result;

  if ( oChannels > 0 ) {

    result = probeDeviceOpen( oParams->deviceId, OUTPUT, oChannels, oParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  if ( iChannels > 0 ) {

    result = probeDeviceOpen( iParams->deviceId, INPUT, iChannels, iParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  stream_.callbackInfo.callback = (void *) callback;
  stream_.callbackInfo.userData = userData;

  if ( options ) options->numberOfBuffers = stream_.nBuffers;
  stream_.state = STREAM_STOPPED;
  return RTAUDIO_NO_ERROR;
}